

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::~CDT(CDT *this)

{
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_cdt_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->m_info).keys.super__Vector_base<double,_std::allocator<double>_>);
  Activation::~Activation(&this->m_function);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&(this->m_output).m_elems);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&(this->m_input).m_elems);
  std::vector<Layer,_std::allocator<Layer>_>::~vector(&this->m_layers);
  DataSet::~DataSet(&this->m_dataset);
  return;
}

Assistant:

CDT::~CDT(){}